

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::shaderexecutor::UnpackUnorm2x16Case::createInstance(UnpackUnorm2x16Case *this,Context *ctx)

{
  TestInstance *this_00;
  
  this_00 = (TestInstance *)operator_new(0xa8);
  UnpackUnorm2x16CaseInstance::UnpackUnorm2x16CaseInstance
            ((UnpackUnorm2x16CaseInstance *)this_00,ctx,
             (this->super_ShaderPackingFunctionCase).m_shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,
             (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_name._M_dataplus._M_p);
  return this_00;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new UnpackUnorm2x16CaseInstance(ctx, m_shaderType, m_spec, getName());
	}